

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.h
# Opt level: O0

void __thiscall miniros::TopicInfo::TopicInfo(TopicInfo *this,TopicInfo *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI + 0x20);
  return;
}

Assistant:

struct MINIROS_DECL TopicInfo {
  TopicInfo() = default;

  TopicInfo(const std::string& _name, const std::string& _datatype /*, const std::string& _md5sum*/)
      : name(_name), datatype(_datatype)
  //, md5sum(_md5sum)
  {
  }

  std::string name;     ///< Name of the topic
  std::string datatype; ///< Datatype of the topic

  // not possible yet unfortunately (master does not have this information)
  // std::string md5sum;      ///< md5sum of the topic
}